

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

void UA_Client_Subscriptions_forceDelete(UA_Client *client,UA_Client_Subscription *sub)

{
  UA_Client_MonitoredItem *pUVar1;
  UA_Client_MonitoredItem *mon_tmp;
  UA_Client_MonitoredItem *mon;
  UA_Client_Subscription *sub_local;
  UA_Client *client_local;
  
  mon_tmp = (sub->monitoredItems).lh_first;
  while (mon_tmp != (UA_Client_MonitoredItem *)0x0) {
    pUVar1 = (mon_tmp->listEntry).le_next;
    UA_NodeId_deleteMembers(&mon_tmp->monitoredNodeId);
    if ((mon_tmp->listEntry).le_next != (UA_Client_MonitoredItem *)0x0) {
      (((mon_tmp->listEntry).le_next)->listEntry).le_prev = (mon_tmp->listEntry).le_prev;
    }
    *(mon_tmp->listEntry).le_prev = (mon_tmp->listEntry).le_next;
    free(mon_tmp);
    mon_tmp = pUVar1;
  }
  if ((sub->listEntry).le_next != (UA_Client_Subscription *)0x0) {
    (((sub->listEntry).le_next)->listEntry).le_prev = (sub->listEntry).le_prev;
  }
  *(sub->listEntry).le_prev = (sub->listEntry).le_next;
  free(sub);
  return;
}

Assistant:

void
UA_Client_Subscriptions_forceDelete(UA_Client *client,
                                    UA_Client_Subscription *sub) {
    UA_Client_MonitoredItem *mon, *mon_tmp;
    LIST_FOREACH_SAFE(mon, &sub->monitoredItems, listEntry, mon_tmp) {
        UA_NodeId_deleteMembers(&mon->monitoredNodeId);
        LIST_REMOVE(mon, listEntry);
        UA_free(mon);
    }
    LIST_REMOVE(sub, listEntry);
    UA_free(sub);
}